

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anytrans.cpp
# Opt level: O0

Transliterator * __thiscall
icu_63::AnyTransliterator::getTransliterator(AnyTransliterator *this,UScriptCode source)

{
  UBool UVar1;
  char *src;
  UnicodeString *pUVar2;
  UMutex *pUVar3;
  Transliterator *temp;
  Mutex m_1;
  Transliterator *rt;
  undefined1 local_c0 [8];
  UnicodeString id;
  UnicodeString sourceName;
  UErrorCode ec;
  Mutex local_30;
  Mutex m;
  Transliterator *t;
  UScriptCode source_local;
  AnyTransliterator *this_local;
  
  if ((source == this->targetScript) || (source == USCRIPT_INVALID_CODE)) {
    this_local = (AnyTransliterator *)0x0;
  }
  else {
    m.fMutex = (UMutex *)0x0;
    Mutex::Mutex(&local_30,(UMutex *)0x0);
    m.fMutex = (UMutex *)uhash_iget_63(this->cache,source);
    Mutex::~Mutex(&local_30);
    if (m.fMutex == (UMutex *)0x0) {
      sourceName.fUnion._48_4_ = 0;
      src = uscript_getShortName_63(source);
      pUVar2 = (UnicodeString *)((long)&id.fUnion + 0x30);
      icu_63::UnicodeString::UnicodeString(pUVar2,src,-1,kInvariant);
      icu_63::UnicodeString::UnicodeString((UnicodeString *)local_c0,pUVar2);
      pUVar2 = icu_63::UnicodeString::append((UnicodeString *)local_c0,L'-');
      icu_63::UnicodeString::append(pUVar2,&this->target);
      m.fMutex = (UMutex *)
                 Transliterator::createInstance
                           ((UnicodeString *)local_c0,UTRANS_FORWARD,
                            (UErrorCode *)(sourceName.fUnion.fStackFields.fBuffer + 0x17));
      UVar1 = ::U_FAILURE(sourceName.fUnion._48_4_);
      if ((UVar1 != '\0') || (m.fMutex == (UMutex *)0x0)) {
        if (m.fMutex != (UMutex *)0x0) {
          (**(code **)(((m.fMutex)->fMutex).__align + 8))();
        }
        icu_63::UnicodeString::operator=
                  ((UnicodeString *)local_c0,(UnicodeString *)((long)&id.fUnion + 0x30));
        ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&rt,L"-Latn;Latn-");
        pUVar2 = icu_63::UnicodeString::append((UnicodeString *)local_c0,(ConstChar16Ptr *)&rt,-1);
        icu_63::UnicodeString::append(pUVar2,&this->target);
        ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&rt);
        m.fMutex = (UMutex *)
                   Transliterator::createInstance
                             ((UnicodeString *)local_c0,UTRANS_FORWARD,
                              (UErrorCode *)(sourceName.fUnion.fStackFields.fBuffer + 0x17));
        UVar1 = ::U_FAILURE(sourceName.fUnion._48_4_);
        if ((UVar1 != '\0') || (m.fMutex == (UMutex *)0x0)) {
          if (m.fMutex != (UMutex *)0x0) {
            (**(code **)(((m.fMutex)->fMutex).__align + 8))();
          }
          m.fMutex = (UMutex *)0x0;
        }
      }
      if (m.fMutex != (UMutex *)0x0) {
        m_1.fMutex = (UMutex *)0x0;
        Mutex::Mutex((Mutex *)&temp,(UMutex *)0x0);
        pUVar3 = (UMutex *)uhash_iget_63(this->cache,source);
        if (pUVar3 == (UMutex *)0x0) {
          m_1.fMutex = pUVar3;
          uhash_iput_63(this->cache,source,m.fMutex,
                        (UErrorCode *)(sourceName.fUnion.fStackFields.fBuffer + 0x17));
        }
        else {
          m_1 = m;
          m.fMutex = pUVar3;
        }
        Mutex::~Mutex((Mutex *)&temp);
        if (m_1.fMutex != (UMutex *)0x0) {
          (**(code **)(((m_1.fMutex)->fMutex).__align + 8))();
        }
      }
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_c0);
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)((long)&id.fUnion + 0x30));
    }
    this_local = (AnyTransliterator *)m.fMutex;
  }
  return &this_local->super_Transliterator;
}

Assistant:

Transliterator* AnyTransliterator::getTransliterator(UScriptCode source) const {

    if (source == targetScript || source == USCRIPT_INVALID_CODE) {
        return NULL;
    }

    Transliterator* t = NULL;
    {
        Mutex m(NULL);
        t = (Transliterator*) uhash_iget(cache, (int32_t) source);
    }
    if (t == NULL) {
        UErrorCode ec = U_ZERO_ERROR;
        UnicodeString sourceName(uscript_getShortName(source), -1, US_INV);
        UnicodeString id(sourceName);
        id.append(TARGET_SEP).append(target);

        t = Transliterator::createInstance(id, UTRANS_FORWARD, ec);
        if (U_FAILURE(ec) || t == NULL) {
            delete t;

            // Try to pivot around Latin, our most common script
            id = sourceName;
            id.append(LATIN_PIVOT, -1).append(target);
            t = Transliterator::createInstance(id, UTRANS_FORWARD, ec);
            if (U_FAILURE(ec) || t == NULL) {
                delete t;
                t = NULL;
            }
        }

        if (t != NULL) {
            Transliterator *rt = NULL;
            {
                Mutex m(NULL);
                rt = static_cast<Transliterator *> (uhash_iget(cache, (int32_t) source));
                if (rt == NULL) {
                    // Common case, no race to cache this new transliterator.
                    uhash_iput(cache, (int32_t) source, t, &ec);
                } else {
                    // Race case, some other thread beat us to caching this transliterator.
                    Transliterator *temp = rt;
                    rt = t;    // Our newly created transliterator that lost the race & now needs deleting.
                    t  = temp; // The transliterator from the cache that we will return.
                }
            }
            delete rt;    // will be non-null only in case of races.
        }
    }
    return t;
}